

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_motion_mode(AV1_COMMON *cm,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,aom_writer *w)

{
  MOTION_MODE MVar1;
  aom_writer *in_RCX;
  long in_RDI;
  MOTION_MODE last_motion_mode_allowed;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int symb;
  
  if ((*(byte *)(in_RDI + 0x1f7) & 1) == 0) {
    MVar1 = '\0';
  }
  else {
    MVar1 = motion_mode_allowed((WarpedMotionParams *)
                                CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                                (MACROBLOCKD *)
                                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                (MB_MODE_INFO *)
                                CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),0);
  }
  symb = CONCAT13(MVar1,(int3)in_stack_ffffffffffffffdc);
  if (MVar1 != '\0') {
    if (MVar1 == '\x01') {
      aom_write_symbol(in_RCX,symb,(aom_cdf_prob *)(ulong)CONCAT14(1,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
    }
    else {
      aom_write_symbol(in_RCX,symb,(aom_cdf_prob *)(ulong)CONCAT14(MVar1,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
    }
  }
  return;
}

Assistant:

static inline void write_motion_mode(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                     const MB_MODE_INFO *mbmi, aom_writer *w) {
  MOTION_MODE last_motion_mode_allowed =
      cm->features.switchable_motion_mode
          ? motion_mode_allowed(cm->global_motion, xd, mbmi,
                                cm->features.allow_warped_motion)
          : SIMPLE_TRANSLATION;
  assert(mbmi->motion_mode <= last_motion_mode_allowed);
  switch (last_motion_mode_allowed) {
    case SIMPLE_TRANSLATION: break;
    case OBMC_CAUSAL:
      aom_write_symbol(w, mbmi->motion_mode == OBMC_CAUSAL,
                       xd->tile_ctx->obmc_cdf[mbmi->bsize], 2);
      break;
    default:
      aom_write_symbol(w, mbmi->motion_mode,
                       xd->tile_ctx->motion_mode_cdf[mbmi->bsize],
                       MOTION_MODES);
  }
}